

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

size_t CLI::detail::close_sequence(string *str,size_t start,char closure_char)

{
  char __c;
  size_type sVar1;
  size_t sVar2;
  ulong uVar3;
  string closures;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &matchBracketChars_abi_cxx11_,closure_char,0);
  if ((sVar1 - 1 < 2) || (sVar1 == 0xffffffffffffffff)) {
    sVar2 = close_literal_quote(str,start,closure_char);
    return sVar2;
  }
  if (sVar1 == 0) {
    sVar2 = close_string_quote(str,start,closure_char);
    return sVar2;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 1;
  local_50.field_2._M_local_buf[1] = '\0';
  local_50.field_2._M_local_buf[0] = closure_char;
  while( true ) {
    start = start + 1;
    uVar3 = str->_M_string_length;
    if (str->_M_string_length <= start) break;
    __c = (str->_M_dataplus)._M_p[start];
    if (__c == local_50._M_dataplus._M_p[local_50._M_string_length - 1]) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                (&local_50);
      uVar3 = start;
      if (local_50._M_string_length == 0) break;
      __c = (str->_M_dataplus)._M_p[start];
    }
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       bracketChars_abi_cxx11_,__c,0);
    if (sVar1 - 1 < 2) {
      start = close_literal_quote(str,start,(str->_M_dataplus)._M_p[start]);
    }
    else if (sVar1 != 0xffffffffffffffff) {
      if (sVar1 == 0) {
        start = close_string_quote(str,start,(str->_M_dataplus)._M_p[start]);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_50,*(char *)(matchBracketChars_abi_cxx11_ + sVar1));
      }
    }
  }
  ::std::__cxx11::string::~string((string *)&local_50);
  return uVar3;
}

Assistant:

CLI11_INLINE std::size_t close_sequence(const std::string &str, std::size_t start, char closure_char) {

    auto bracket_loc = matchBracketChars.find(closure_char);
    switch(bracket_loc) {
    case 0:
        return close_string_quote(str, start, closure_char);
    case 1:
    case 2:
    case std::string::npos:
        return close_literal_quote(str, start, closure_char);
    default:
        break;
    }

    std::string closures(1, closure_char);
    auto loc = start + 1;

    while(loc < str.size()) {
        if(str[loc] == closures.back()) {
            closures.pop_back();
            if(closures.empty()) {
                return loc;
            }
        }
        bracket_loc = bracketChars.find(str[loc]);
        if(bracket_loc != std::string::npos) {
            switch(bracket_loc) {
            case 0:
                loc = close_string_quote(str, loc, str[loc]);
                break;
            case 1:
            case 2:
                loc = close_literal_quote(str, loc, str[loc]);
                break;
            default:
                closures.push_back(matchBracketChars[bracket_loc]);
                break;
            }
        }
        ++loc;
    }
    if(loc > str.size()) {
        loc = str.size();
    }
    return loc;
}